

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.cpp
# Opt level: O3

string * pprint__abi_cxx11_(string *__return_storage_ptr__,thing *t,int i)

{
  long lVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar3 = (char)__return_storage_ptr__;
  iVar2 = i;
  if (0 < i) {
    do {
      std::__cxx11::string::push_back(cVar3);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if (t->t == TOKEN) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(t + 2),*(long *)(t + 4) + *(long *)(t + 2));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else if (t->t == EXPRESSION) {
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
    lVar1 = *(long *)(t + 2);
    if (*(long *)(t + 4) != lVar1) {
      uVar4 = 0;
      do {
        pprint__abi_cxx11_(&local_50,*(thing **)(lVar1 + uVar4 * 8),i + 1);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        std::__cxx11::string::push_back(cVar3);
        uVar4 = uVar4 + 1;
        lVar1 = *(long *)(t + 2);
      } while (uVar4 < (ulong)(*(long *)(t + 4) - lVar1 >> 3));
    }
    if (0 < i) {
      do {
        std::__cxx11::string::push_back(cVar3);
        i = i + -1;
      } while (i != 0);
    }
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pprint_(parser::thing *t, int i) {

  std::string s;

  for (int j = 0; j < i; j++) {
    s.push_back('\t');
  }

  if (t->t==parser::type::TOKEN) {
    s += ((static_cast<parser::token *>(t))->get_content());
  } else if (t->t==parser::type::EXPRESSION) {

    s.push_back('(');
    s.push_back('\n');

    parser::expression *e = static_cast<parser::expression *>(t);

    for (int j = 0; j < e->things.size(); j++) {
      s += pprint_(e->things[j], i + 1);
      s.push_back('\n');
    }

    for (int j = 0; j < i; j++) {
      s.push_back('\t');
    }

    s.push_back(')');
    s.push_back('\n');

  }

  return s;

}